

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QWidget * __thiscall
QWidgetPrivate::childAtRecursiveHelper
          (QWidgetPrivate *this,QPointF *p,bool ignoreChildrenInDestructor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QWidgetData *pQVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  undefined4 uVar9;
  uint uVar10;
  long lVar11;
  QWidget *pQVar13;
  uint uVar14;
  long in_FS_OFFSET;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  QPointF local_78;
  ulong local_60;
  QPointF local_58;
  double local_48;
  double dStack_40;
  long local_38;
  undefined8 uVar12;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar14 = *(uint *)&this->field_0x28;
  pQVar8 = (QWidget *)(ulong)ignoreChildrenInDestructor;
  do {
    uVar14 = uVar14 - 1;
    if ((int)uVar14 < 0) {
      pQVar8 = (QWidget *)0x0;
      break;
    }
    lVar11 = *(long *)&this->field_0x20;
    pQVar13 = *(QWidget **)(lVar11 + (ulong)(uVar14 & 0x7fffffff) * 8);
    if ((pQVar13 == (QWidget *)0x0) ||
       (lVar11 = *(long *)&pQVar13->field_0x8, (*(byte *)(lVar11 + 0x30) & 1) == 0)) {
      pQVar13 = (QWidget *)0x0;
    }
    uVar12 = CONCAT71((int7)((ulong)lVar11 >> 8),1);
    uVar9 = (undefined4)uVar12;
    if (((((pQVar13 != (QWidget *)0x0) &&
          (pQVar3 = pQVar13->data,
          ((pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) &&
         ((pQVar3->widget_attributes & 0x10000) == 0)) &&
        ((*(byte *)(*(long *)&pQVar13->field_0x8 + 0x242) & 8) == 0)) &&
       ((!ignoreChildrenInDestructor || ((pQVar3->field_0x12 & 4) == 0)))) {
      uVar1 = (pQVar3->crect).x1;
      uVar2 = (pQVar3->crect).y1;
      local_78.xp = p->xp - (double)(int)uVar1;
      local_78.yp = p->yp - (double)(int)uVar2;
      lVar11 = *(long *)&pQVar13->field_0x8;
      lVar4 = *(long *)(lVar11 + 8);
      lVar5 = *(long *)(lVar4 + 0x20);
      auVar20._0_4_ = (*(uint *)(lVar5 + 0x14) ^ 0xffffffff) + (int)*(undefined8 *)(lVar5 + 0x1c);
      auVar20._4_4_ =
           (*(uint *)(lVar5 + 0x18) ^ 0xffffffff) +
           (int)((ulong)*(undefined8 *)(lVar5 + 0x1c) >> 0x20);
      auVar20._8_4_ = 0xffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar16._0_4_ = -(uint)(-1 < auVar20._0_4_);
      auVar16._4_4_ = -(uint)(-1 < auVar20._4_4_);
      auVar16._8_8_ = 0;
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar17 = auVar16 ^ auVar17 | auVar20 & auVar16;
      local_58.xp = 0.0;
      local_58.yp = 0.0;
      auVar18._0_8_ = auVar17._0_8_;
      auVar18._8_4_ = auVar17._4_4_;
      auVar18._12_4_ = -(uint)(auVar17._4_4_ < 0);
      uVar15 = CONCAT44(-(uint)(auVar17._0_4_ < 0),auVar17._0_4_) + 1;
      uVar19 = auVar18._8_8_ + 1;
      local_48 = ((double)(uVar15 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(uVar15 & 0xffffffff | 0x4330000000000000);
      dStack_40 = ((double)(uVar19 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                  (double)(uVar19 & 0xffffffff | 0x4330000000000000);
      cVar6 = QRectF::contains(&local_58);
      if (cVar6 == '\0') {
        uVar12 = 1;
      }
      else {
        lVar11 = *(long *)(lVar11 + 0x78);
        if (((lVar11 != 0) && ((*(byte *)(lVar11 + 0x7c) & 0x80) != 0)) &&
           ((*(byte *)(*(long *)(lVar4 + 8) + 0x244) & 0x80) == 0)) {
          auVar21._0_8_ =
               (double)((ulong)local_78.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_78.xp;
          auVar21._8_8_ =
               (double)((ulong)local_78.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_78.yp;
          auVar17 = minpd(_DAT_0066f5d0,auVar21);
          auVar22._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
          auVar22._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
          uVar10 = movmskpd(uVar9,auVar22);
          if ((uVar10 & 2) == 0) {
            local_60 = 0x8000000000000000;
          }
          else {
            local_60 = (ulong)(uint)(int)auVar17._8_8_ << 0x20;
          }
          if ((uVar10 & 1) == 0) {
            uVar15 = 0x80000000;
          }
          else {
            uVar15 = (ulong)(uint)(int)auVar17._0_8_;
          }
          local_60 = local_60 | uVar15;
          cVar6 = QRegion::contains((QPoint *)(lVar11 + 0x40));
          uVar12 = 1;
          if (cVar6 == '\0') goto LAB_0030d7f6;
        }
        pQVar7 = childAtRecursiveHelper
                           (*(QWidgetPrivate **)&pQVar13->field_0x8,&local_78,
                            ignoreChildrenInDestructor);
        pQVar8 = pQVar13;
        if (pQVar7 != (QWidget *)0x0) {
          pQVar8 = pQVar7;
        }
        uVar12 = 0;
      }
    }
LAB_0030d7f6:
  } while ((char)uVar12 != '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar8;
}

Assistant:

QWidget *QWidgetPrivate::childAtRecursiveHelper(const QPointF &p, bool ignoreChildrenInDestructor) const
{
    for (int i = children.size() - 1; i >= 0; --i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (!child || child->isWindow() || child->isHidden() || child->testAttribute(Qt::WA_TransparentForMouseEvents)
            || (ignoreChildrenInDestructor && child->data->in_destructor)) {
            continue;
        }

        // Map the point 'p' from parent coordinates to child coordinates.
        QPointF childPoint = p;
        childPoint -= child->data->crect.topLeft();

        // Check if the point hits the child.
        if (!child->d_func()->pointInsideRectAndMask(childPoint))
            continue;

        // Do the same for the child's descendants.
        if (QWidget *w = child->d_func()->childAtRecursiveHelper(childPoint, ignoreChildrenInDestructor))
            return w;

        // We have found our target; namely the child at position 'p'.
        return child;
    }
    return nullptr;
}